

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *vec)

{
  int iVar1;
  fpclass_type fVar2;
  pointer pnVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int32_t iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  int *piVar16;
  byte bVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar17 = 0;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  lVar9 = (long)this->thedim;
  if (lVar9 != 0) {
    pnVar3 = (this->l).rval.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->l).ridx;
    piVar5 = (this->l).rbeg;
    piVar6 = (this->l).rorig;
    do {
      lVar15 = (long)piVar6[lVar9 + -1];
      pnVar11 = vec + lVar15;
      pcVar13 = &local_b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar13->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4);
      }
      local_b8.exp = vec[lVar15].m_backend.exp;
      local_b8.neg = vec[lVar15].m_backend.neg;
      fVar2 = vec[lVar15].m_backend.fpclass;
      iVar7 = vec[lVar15].m_backend.prec_elem;
      local_b8.fpclass = fVar2;
      local_b8.prec_elem = iVar7;
      if (fVar2 == cpp_dec_float_NaN) {
LAB_005499d3:
        iVar8 = piVar5[lVar15];
        iVar1 = piVar5[lVar15 + 1];
        if (iVar8 < iVar1) {
          piVar16 = piVar4 + iVar8;
          pcVar13 = &pnVar3[iVar8].m_backend;
          iVar8 = (iVar1 - iVar8) + 1;
          do {
            local_138.fpclass = cpp_dec_float_finite;
            local_138.prec_elem = 0x1c;
            local_138.data._M_elems[0] = 0;
            local_138.data._M_elems[1] = 0;
            local_138.data._M_elems[2] = 0;
            local_138.data._M_elems[3] = 0;
            local_138.data._M_elems[4] = 0;
            local_138.data._M_elems[5] = 0;
            local_138.data._M_elems[6] = 0;
            local_138.data._M_elems[7] = 0;
            local_138.data._M_elems[8] = 0;
            local_138.data._M_elems[9] = 0;
            local_138.data._M_elems[10] = 0;
            local_138.data._M_elems[0xb] = 0;
            local_138.data._M_elems[0xc] = 0;
            local_138.data._M_elems[0xd] = 0;
            local_138.data._M_elems[0xe] = 0;
            local_138.data._M_elems[0xf] = 0;
            local_138.data._M_elems[0x10] = 0;
            local_138.data._M_elems[0x11] = 0;
            local_138.data._M_elems[0x12] = 0;
            local_138.data._M_elems[0x13] = 0;
            local_138.data._M_elems[0x14] = 0;
            local_138.data._M_elems[0x15] = 0;
            local_138.data._M_elems[0x16] = 0;
            local_138.data._M_elems[0x17] = 0;
            local_138.data._M_elems[0x18] = 0;
            local_138.data._M_elems[0x19] = 0;
            local_138.data._M_elems._104_5_ = 0;
            local_138.data._M_elems[0x1b]._1_3_ = 0;
            local_138.exp = 0;
            local_138.neg = false;
            pcVar12 = &local_b8;
            if (pcVar13 != &local_138) {
              pcVar14 = &local_138;
              for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_138.exp = local_b8.exp;
              local_138.neg = local_b8.neg;
              local_138.fpclass = local_b8.fpclass;
              local_138.prec_elem = local_b8.prec_elem;
              pcVar12 = pcVar13;
            }
            pcVar13 = pcVar13 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_138,pcVar12);
            iVar1 = *piVar16;
            piVar16 = piVar16 + 1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&vec[iVar1].m_backend,&local_138);
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
        }
      }
      else {
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_138,0.0);
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b8,&local_138);
        if (iVar8 != 0) goto LAB_005499d3;
      }
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}